

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

ContextRef VerifyContext(ALCcontext *context)

{
  __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
  __last;
  bool bVar1;
  reference ppAVar2;
  ALCcontext *in_RSI;
  ALCcontext *in_RDI;
  bool bVar3;
  __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
  iter;
  lock_guard<std::recursive_mutex> _;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  ALCcontext *__lhs;
  ALCcontext **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
  local_20 [2];
  ALCcontext *local_10;
  
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RDI,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>::begin
            ((vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>::end
            ((vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  __last._M_current._4_4_ = in_stack_ffffffffffffffb4;
  __last._M_current._0_4_ = in_stack_ffffffffffffffb0;
  local_20[0] = std::
                lower_bound<__gnu_cxx::__normal_iterator<ALCcontext**,std::vector<ALCcontext*,al::allocator<ALCcontext*,8ul>>>,ALCcontext*>
                          (in_stack_ffffffffffffffb8,__last,in_stack_ffffffffffffffa8);
  std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>::end
            ((vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
                      *)__lhs,(__normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar3 = false;
  if (bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
              ::operator*(local_20);
    bVar3 = *ppAVar2 == local_10;
  }
  if (bVar3) {
    __gnu_cxx::
    __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
    ::operator*(local_20);
    al::intrusive_ref<ALCcontext>::add_ref((intrusive_ref<ALCcontext> *)0x180a8a);
    ppAVar2 = __gnu_cxx::
              __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
              ::operator*(local_20);
    al::intrusive_ptr<ALCcontext>::intrusive_ptr((intrusive_ptr<ALCcontext> *)__lhs,*ppAVar2);
  }
  else {
    al::intrusive_ptr<ALCcontext>::intrusive_ptr((intrusive_ptr<ALCcontext> *)__lhs,(nullptr_t)0x0);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x180ae5);
  return (ContextRef)in_RDI;
}

Assistant:

static ContextRef VerifyContext(ALCcontext *context)
{
    std::lock_guard<std::recursive_mutex> _{ListLock};
    auto iter = std::lower_bound(ContextList.begin(), ContextList.end(), context);
    if(iter != ContextList.end() && *iter == context)
    {
        (*iter)->add_ref();
        return ContextRef{*iter};
    }
    return nullptr;
}